

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_ClearInitToOrig(Abc_Obj_t *pInit)

{
  int iVar1;
  uint uVar2;
  NodeLag_t *pNVar3;
  int oldSize;
  int id;
  Abc_Obj_t *pInit_local;
  
  uVar2 = Abc_ObjId(pInit);
  if (pManMR->sizeInitToOrig <= (int)uVar2) {
    iVar1 = pManMR->sizeInitToOrig;
    pManMR->sizeInitToOrig = (int)((double)(int)uVar2 * 1.5 + 10.0);
    pNVar3 = (NodeLag_t *)realloc(pManMR->pInitToOrig,(long)pManMR->sizeInitToOrig << 3);
    pManMR->pInitToOrig = pNVar3;
    memset(pManMR->pInitToOrig + iVar1,0,(long)(pManMR->sizeInitToOrig - iVar1) << 3);
  }
  if (pManMR->pInitToOrig != (NodeLag_t *)0x0) {
    pManMR->pInitToOrig[(int)uVar2].id = -1;
    return;
  }
  __assert_fail("pManMR->pInitToOrig",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                ,0x4f4,"void Abc_FlowRetime_ClearInitToOrig(Abc_Obj_t *)");
}

Assistant:

void Abc_FlowRetime_ClearInitToOrig( Abc_Obj_t *pInit )
{
  int id = Abc_ObjId( pInit );
  
  // grow data structure if necessary
  if (id >= pManMR->sizeInitToOrig) {
    int oldSize = pManMR->sizeInitToOrig;
    pManMR->sizeInitToOrig = 1.5*id + 10;
    pManMR->pInitToOrig = (NodeLag_t*)realloc(pManMR->pInitToOrig, sizeof(NodeLag_t)*pManMR->sizeInitToOrig);
    memset( &(pManMR->pInitToOrig[oldSize]), 0, sizeof(NodeLag_t)*(pManMR->sizeInitToOrig-oldSize) );
  }
  assert( pManMR->pInitToOrig );

  pManMR->pInitToOrig[id].id = -1;
}